

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

void ecc_weierstrass_epilogue
               (mp_int *Px,mp_int *Qx,mp_int *Py,mp_int *common_Z,mp_int *lambda_n,mp_int *lambda_d,
               WeierstrassPoint *out)

{
  WeierstrassCurve *pWVar1;
  mp_int *x;
  mp_int *y;
  mp_int *x_00;
  mp_int *y_00;
  mp_int *y_01;
  mp_int *pmVar2;
  mp_int *y_02;
  mp_int *x_01;
  mp_int *y_03;
  mp_int *pmVar3;
  
  pWVar1 = out->wc;
  x = monty_mul(pWVar1->mc,lambda_n,lambda_n);
  y = monty_mul(pWVar1->mc,lambda_d,lambda_d);
  x_00 = monty_mul(pWVar1->mc,lambda_d,y);
  y_00 = monty_add(pWVar1->mc,Px,Qx);
  y_01 = monty_mul(pWVar1->mc,y,y_00);
  pmVar2 = monty_sub(pWVar1->mc,x,y_01);
  out->X = pmVar2;
  pmVar2 = monty_mul(pWVar1->mc,y,Px);
  y_02 = monty_sub(pWVar1->mc,pmVar2,out->X);
  x_01 = monty_mul(pWVar1->mc,lambda_n,y_02);
  y_03 = monty_mul(pWVar1->mc,x_00,Py);
  pmVar3 = monty_sub(pWVar1->mc,x_01,y_03);
  out->Y = pmVar3;
  pmVar3 = monty_mul(pWVar1->mc,common_Z,lambda_d);
  out->Z = pmVar3;
  mp_free(x);
  mp_free(y);
  mp_free(x_00);
  mp_free(y_00);
  mp_free(y_02);
  mp_free(y_01);
  mp_free(x_01);
  mp_free(pmVar2);
  mp_free(y_03);
  return;
}

Assistant:

static inline void ecc_weierstrass_epilogue(
    mp_int *Px, mp_int *Qx, mp_int *Py, mp_int *common_Z,
    mp_int *lambda_n, mp_int *lambda_d, WeierstrassPoint *out)
{
    WeierstrassCurve *wc = out->wc;

    /* Powers of the numerator and denominator of the slope lambda */
    mp_int *lambda_n2 = monty_mul(wc->mc, lambda_n, lambda_n);
    mp_int *lambda_d2 = monty_mul(wc->mc, lambda_d, lambda_d);
    mp_int *lambda_d3 = monty_mul(wc->mc, lambda_d, lambda_d2);

    /* Make the output x-coordinate */
    mp_int *xsum = monty_add(wc->mc, Px, Qx);
    mp_int *lambda_d2_xsum = monty_mul(wc->mc, lambda_d2, xsum);
    out->X = monty_sub(wc->mc, lambda_n2, lambda_d2_xsum);

    /* Make the output y-coordinate */
    mp_int *lambda_d2_Px = monty_mul(wc->mc, lambda_d2, Px);
    mp_int *xdiff = monty_sub(wc->mc, lambda_d2_Px, out->X);
    mp_int *lambda_n_xdiff = monty_mul(wc->mc, lambda_n, xdiff);
    mp_int *lambda_d3_Py = monty_mul(wc->mc, lambda_d3, Py);
    out->Y = monty_sub(wc->mc, lambda_n_xdiff, lambda_d3_Py);

    /* Make the output z-coordinate */
    out->Z = monty_mul(wc->mc, common_Z, lambda_d);

    mp_free(lambda_n2);
    mp_free(lambda_d2);
    mp_free(lambda_d3);
    mp_free(xsum);
    mp_free(xdiff);
    mp_free(lambda_d2_xsum);
    mp_free(lambda_n_xdiff);
    mp_free(lambda_d2_Px);
    mp_free(lambda_d3_Py);
}